

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a0370 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a0377._0_1_ = '.';
    uRam00000000001a0377._1_1_ = '.';
    uRam00000000001a0377._2_1_ = '.';
    uRam00000000001a0377._3_1_ = '.';
    uRam00000000001a0377._4_1_ = '.';
    uRam00000000001a0377._5_1_ = '.';
    uRam00000000001a0377._6_1_ = '.';
    uRam00000000001a0377._7_1_ = '.';
    DAT_001a0360 = '.';
    DAT_001a0360_1._0_1_ = '.';
    DAT_001a0360_1._1_1_ = '.';
    DAT_001a0360_1._2_1_ = '.';
    DAT_001a0360_1._3_1_ = '.';
    DAT_001a0360_1._4_1_ = '.';
    DAT_001a0360_1._5_1_ = '.';
    DAT_001a0360_1._6_1_ = '.';
    uRam00000000001a0368 = 0x2e2e2e2e2e2e2e;
    DAT_001a036f = 0x2e;
    DAT_001a0350 = '.';
    DAT_001a0350_1._0_1_ = '.';
    DAT_001a0350_1._1_1_ = '.';
    DAT_001a0350_1._2_1_ = '.';
    DAT_001a0350_1._3_1_ = '.';
    DAT_001a0350_1._4_1_ = '.';
    DAT_001a0350_1._5_1_ = '.';
    DAT_001a0350_1._6_1_ = '.';
    uRam00000000001a0358._0_1_ = '.';
    uRam00000000001a0358._1_1_ = '.';
    uRam00000000001a0358._2_1_ = '.';
    uRam00000000001a0358._3_1_ = '.';
    uRam00000000001a0358._4_1_ = '.';
    uRam00000000001a0358._5_1_ = '.';
    uRam00000000001a0358._6_1_ = '.';
    uRam00000000001a0358._7_1_ = '.';
    DAT_001a0340 = '.';
    DAT_001a0340_1._0_1_ = '.';
    DAT_001a0340_1._1_1_ = '.';
    DAT_001a0340_1._2_1_ = '.';
    DAT_001a0340_1._3_1_ = '.';
    DAT_001a0340_1._4_1_ = '.';
    DAT_001a0340_1._5_1_ = '.';
    DAT_001a0340_1._6_1_ = '.';
    uRam00000000001a0348._0_1_ = '.';
    uRam00000000001a0348._1_1_ = '.';
    uRam00000000001a0348._2_1_ = '.';
    uRam00000000001a0348._3_1_ = '.';
    uRam00000000001a0348._4_1_ = '.';
    uRam00000000001a0348._5_1_ = '.';
    uRam00000000001a0348._6_1_ = '.';
    uRam00000000001a0348._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001a0338._0_1_ = '.';
    uRam00000000001a0338._1_1_ = '.';
    uRam00000000001a0338._2_1_ = '.';
    uRam00000000001a0338._3_1_ = '.';
    uRam00000000001a0338._4_1_ = '.';
    uRam00000000001a0338._5_1_ = '.';
    uRam00000000001a0338._6_1_ = '.';
    uRam00000000001a0338._7_1_ = '.';
    DAT_001a037f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}